

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int IoCommandWrite(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *__s;
  Abc_Ntk_t *pNtk;
  int iVar1;
  Io_FileType_t FileType;
  size_t sVar2;
  char *pcVar3;
  int c;
  char *pFileName;
  char Command [1000];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (argc == globalUtilOptind + 1)) {
    __s = argv[globalUtilOptind];
    pFileName._0_1_ = '\0';
    sVar2 = strlen(__s);
    if (899 < sVar2) {
      __assert_fail("strlen(pFileName) < 900",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/io.c"
                    ,0x4e2,"int IoCommandWrite(Abc_Frame_t *, int, char **)");
    }
    pcVar3 = Extra_FileNameExtension(__s);
    iVar1 = strcmp(pcVar3,"genlib");
    if (iVar1 == 0) {
      sprintf((char *)&pFileName,"write_genlib %s",__s);
    }
    else {
      pcVar3 = Extra_FileNameExtension(__s);
      iVar1 = strcmp(pcVar3,"lib");
      if (iVar1 == 0) {
        sprintf((char *)&pFileName,"write_liberty %s",__s);
      }
      else {
        pcVar3 = Extra_FileNameExtension(__s);
        iVar1 = strcmp(pcVar3,"dsd");
        if (iVar1 == 0) {
          sprintf((char *)&pFileName,"dsd_save %s",__s);
        }
      }
    }
    if ((char)pFileName == '\0') {
      if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
        fprintf((FILE *)pAbc->Out,"Empty network.\n");
        pAbc_local._4_4_ = 0;
      }
      else {
        pNtk = pAbc->pNtkCur;
        FileType = Io_ReadFileType(__s);
        Io_Write(pNtk,__s,FileType);
        pAbc_local._4_4_ = 0;
      }
    }
    else {
      Cmd_CommandExecute(pAbc,(char *)&pFileName);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    fprintf((FILE *)pAbc->Err,"usage: write [-h] <file>\n");
    fprintf((FILE *)pAbc->Err,"\t         writes the current network into <file> by calling\n");
    fprintf((FILE *)pAbc->Err,"\t         the writer that matches the extension of <file>\n");
    fprintf((FILE *)pAbc->Err,"\t-h     : print the help massage\n");
    fprintf((FILE *)pAbc->Err,"\tfile   : the name of the file to write\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int IoCommandWrite( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char Command[1000];
    char * pFileName;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    // write libraries
    Command[0] = 0;
    assert( strlen(pFileName) < 900 );
    if ( !strcmp( Extra_FileNameExtension(pFileName), "genlib" )  )
        sprintf( Command, "write_genlib %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "lib" ) )
        sprintf( Command, "write_liberty %s", pFileName );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "dsd" ) )
        sprintf( Command, "dsd_save %s", pFileName );
    if ( Command[0] )
    {
        Cmd_CommandExecute( pAbc, Command );
        return 0;
    }
    if ( pAbc->pNtkCur == NULL )
    {
        fprintf( pAbc->Out, "Empty network.\n" );
        return 0;
    }
    // call the corresponding file writer
    Io_Write( pAbc->pNtkCur, pFileName, Io_ReadFileType(pFileName) );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         writes the current network into <file> by calling\n" );
    fprintf( pAbc->Err, "\t         the writer that matches the extension of <file>\n" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}